

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O1

Result<wasm::Ok> * __thiscall
Shell::checkNaN(Result<wasm::Ok> *__return_storage_ptr__,Shell *this,Literal *val,NaNResult nan)

{
  undefined8 *puVar1;
  char cVar2;
  ostream *poVar3;
  Type TVar4;
  undefined1 auStack_208 [16];
  stringstream err;
  ostream local_1f0 [112];
  ios_base local_180 [264];
  Literal local_78;
  Literal local_60;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  undefined8 uStack_30;
  
  TVar4 = nan.type.id;
  std::__cxx11::stringstream::stringstream((stringstream *)(auStack_208 + 8));
  if (nan.kind == Arithmetic) {
    if ((val->type).id == TVar4.id) {
      cVar2 = wasm::Literal::isArithmeticNaN();
      if (cVar2 != '\0') goto LAB_001465ea;
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1f0,"expected arithmetic ",0x14);
    poVar3 = (ostream *)wasm::operator<<(local_1f0,TVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," NaN, got ",10);
    wasm::Literal::Literal(&local_60,val);
    wasm::operator<<(poVar3,_auStack_208);
    wasm::Literal::~Literal(&local_60);
    std::__cxx11::stringbuf::str();
  }
  else {
    if (nan.kind != Canonical) {
LAB_001465ea:
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
      goto LAB_001466a4;
    }
    if ((val->type).id == TVar4.id) {
      cVar2 = wasm::Literal::isCanonicalNaN();
      if (cVar2 != '\0') goto LAB_001465ea;
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1f0,"expected canonical ",0x13);
    poVar3 = (ostream *)wasm::operator<<(local_1f0,TVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," NaN, got ",10);
    wasm::Literal::Literal(&local_78,val);
    wasm::operator<<(poVar3,_auStack_208);
    wasm::Literal::~Literal(&local_78);
    std::__cxx11::stringbuf::str();
  }
  puVar1 = (undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
  *(undefined8 **)
   &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
  if (local_48 == &local_38) {
    *puVar1 = CONCAT71(uStack_37,local_38);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_30;
  }
  else {
    *(undefined1 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_48;
    *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
         CONCAT71(uStack_37,local_38);
  }
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_40;
  local_40 = 0;
  local_38 = 0;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
  local_48 = &local_38;
LAB_001466a4:
  std::__cxx11::stringstream::~stringstream((stringstream *)(auStack_208 + 8));
  std::ios_base::~ios_base(local_180);
  return __return_storage_ptr__;
}

Assistant:

Result<> checkNaN(Literal val, NaNResult nan) {
    std::stringstream err;
    switch (nan.kind) {
      case NaNKind::Canonical:
        if (val.type != nan.type || !val.isCanonicalNaN()) {
          err << "expected canonical " << nan.type << " NaN, got " << val;
          return Err{err.str()};
        }
        break;
      case NaNKind::Arithmetic:
        if (val.type != nan.type || !val.isArithmeticNaN()) {
          err << "expected arithmetic " << nan.type << " NaN, got " << val;
          return Err{err.str()};
        }
        break;
    }
    return Ok{};
  }